

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer_EveryoneWrites_Async.cpp
# Opt level: O1

void __thiscall
adios2::core::engine::BP5Writer::AsyncWriteDataCleanup_EveryoneWrites(BP5Writer *this)

{
  TokenChain<unsigned_long> *this_00;
  AsyncWriteInfo *pAVar1;
  pointer pCVar2;
  
  this_00 = this->m_AsyncWriteInfo->tokenChain;
  if (this_00 != (TokenChain<unsigned_long> *)0x0) {
    shm::TokenChain<unsigned_long>::~TokenChain(this_00);
    operator_delete(this_00);
  }
  pAVar1 = this->m_AsyncWriteInfo;
  if (pAVar1 != (AsyncWriteInfo *)0x0) {
    pCVar2 = (pAVar1->expectedComputationBlocks).
             super__Vector_base<adios2::core::engine::BP5Writer::ComputationBlockInfo,_std::allocator<adios2::core::engine::BP5Writer::ComputationBlockInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pCVar2 != (pointer)0x0) {
      operator_delete(pCVar2);
    }
    helper::Comm::~Comm(&pAVar1->comm_chain);
    operator_delete(pAVar1);
  }
  this->m_AsyncWriteInfo = (AsyncWriteInfo *)0x0;
  return;
}

Assistant:

void BP5Writer::AsyncWriteDataCleanup_EveryoneWrites()
{
    if (m_AsyncWriteInfo->tokenChain)
    {
        delete m_AsyncWriteInfo->tokenChain;
    }
    delete m_AsyncWriteInfo;
    m_AsyncWriteInfo = nullptr;
}